

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall phosg::BitmapImage::BitmapImage(BitmapImage *this,size_t w,size_t h)

{
  ulong uVar1;
  uint8_t *__s;
  
  this->width = w;
  this->height = h;
  uVar1 = w + 7 >> 3;
  this->row_bytes = uVar1;
  uVar1 = h * uVar1;
  __s = (uint8_t *)operator_new__(uVar1);
  this->data = __s;
  memset(__s,0,uVar1);
  return;
}

Assistant:

BitmapImage::BitmapImage(size_t w, size_t h)
    : width(w),
      height(h),
      row_bytes(byte_count_for_bit_count(this->width)),
      data(new uint8_t[this->get_data_size()]) {
  memset(this->data, 0, this->get_data_size());
}